

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

int share_connstate_cmp(void *av,void *bv)

{
  ssh_sharing_connstate *b;
  ssh_sharing_connstate *a;
  void *bv_local;
  void *av_local;
  
  if (*av < *bv) {
    av_local._4_4_ = -1;
  }
  else if (*bv < *av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int share_connstate_cmp(void *av, void *bv)
{
    const struct ssh_sharing_connstate *a =
        (const struct ssh_sharing_connstate *)av;
    const struct ssh_sharing_connstate *b =
        (const struct ssh_sharing_connstate *)bv;

    if (a->id < b->id)
        return -1;
    else if (a->id > b->id)
        return +1;
    else
        return 0;
}